

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_test.cc
# Opt level: O0

void __thiscall
writer_test_should_write_utc_timestamp_field_Test::TestBody
          (writer_test_should_write_utc_timestamp_field_Test *this)

{
  char **this_00;
  bool bVar1;
  char *message;
  Field<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_> *field_00;
  AssertHelper local_238;
  Message local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [8];
  AssertionResult gtest_ar;
  ostringstream local_1e8 [8];
  ostringstream oss;
  time_t local_70;
  time_t ts;
  tm tm;
  Field field;
  writer_test_should_write_utc_timestamp_field_Test *this_local;
  
  this_00 = &tm.tm_zone;
  Fixpp::Field<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>::Field
            ((Field<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_> *)this_00);
  tm.tm_wday = 0;
  tm.tm_yday = 0;
  tm.tm_isdst = 0;
  tm._36_4_ = 0;
  tm.tm_mon = 0;
  tm.tm_year = 0;
  tm.tm_gmtoff = 0;
  tm.tm_hour = 4;
  tm.tm_mday = 0x75;
  tm.tm_sec = 0xd;
  tm.tm_min = 0x10;
  ts = 0x2d0000001e;
  local_70 = mkgmtime((tm *)&ts);
  Fixpp::Field<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>::set<long&>
            ((Field<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>> *)this_00,&local_70);
  std::__cxx11::ostringstream::ostringstream(local_1e8);
  Fixpp::writeField<Fixpp::Field<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>>
            ((Fixpp *)local_1e8,(ostream *)this_00,field_00);
  std::__cxx11::ostringstream::str();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[22]>
            ((EqHelper<false> *)local_208,"oss.str()","\"52=20170516-13:45:30|\"",&local_228,
             (char (*) [22])"52=20170516-13:45:30|");
  std::__cxx11::string::~string((string *)&local_228);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_208);
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/writer_test.cc"
               ,0x8d,message);
    testing::internal::AssertHelper::operator=(&local_238,&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  std::__cxx11::ostringstream::~ostringstream(local_1e8);
  return;
}

Assistant:

TEST(writer_test, should_write_utc_timestamp_field)
{
    using Field = Fixpp::Field<Fixpp::Tag::SendingTime>;
    Field field;

    std::tm tm{};
    tm.tm_year = 117;
    tm.tm_mon = 4;
    tm.tm_mday = 16;
    tm.tm_hour = 13;
    tm.tm_min = 45;
    tm.tm_sec = 30;

    auto ts = mkgmtime(&tm);
    field.set(ts);

    std::ostringstream oss;
    writeField(oss, field);

    ASSERT_EQ(oss.str(), "52=20170516-13:45:30|");
}